

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rule.cpp
# Opt level: O2

void __thiscall Rule::Rule(Rule *this,string *line)

{
  bool bVar1;
  long lVar2;
  undefined4 *puVar3;
  pointer __lhs;
  _Alloc_hider __lhs_00;
  Color *this_00;
  string *psVar4;
  string rest;
  string color_name;
  Nibbler n;
  string pattern;
  string rest_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  
  this->_vptr_Rule = (_func_int **)&PTR__Rule_00112d80;
  (this->section)._M_dataplus._M_p = (pointer)&(this->section).field_2;
  (this->section)._M_string_length = 0;
  (this->section).field_2._M_local_buf[0] = '\0';
  this_00 = &this->color;
  Color::Color(this_00);
  (this->context)._M_dataplus._M_p = (pointer)&(this->context).field_2;
  (this->context)._M_string_length = 0;
  psVar4 = &this->context;
  (this->context).field_2._M_local_buf[0] = '\0';
  RX::RX(&this->rx);
  (this->fragment)._M_dataplus._M_p = (pointer)&(this->fragment).field_2;
  (this->fragment)._M_string_length = 0;
  (this->fragment).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&this->fragment);
  Nibbler::Nibbler(&n,line);
  Nibbler::skipWS(&n);
  pattern._M_dataplus._M_p = (pointer)&pattern.field_2;
  pattern._M_string_length = 0;
  pattern.field_2._M_local_buf[0] = '\0';
  bVar1 = Nibbler::getUntilWS(&n,&this->section);
  if (bVar1) {
    bVar1 = Nibbler::skipWS(&n);
    if (!bVar1) goto LAB_0010b004;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rest_1,"rule",(allocator<char> *)&rest);
    bVar1 = Nibbler::getLiteral(&n,&rest_1);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&rest_1);
      goto LAB_0010b004;
    }
    bVar1 = Nibbler::skipWS(&n);
    std::__cxx11::string::~string((string *)&rest_1);
    if (!bVar1) goto LAB_0010b004;
    bVar1 = Nibbler::getQuoted(&n,'/',&pattern,false);
    if (bVar1) {
      bVar1 = Nibbler::skipWS(&n);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rest_1,"-->",(allocator<char> *)&rest);
        bVar1 = Nibbler::getLiteral(&n,&rest_1);
        std::__cxx11::string::~string((string *)&rest_1);
        if (bVar1) {
          Nibbler::skipWS(&n);
          rest._M_dataplus._M_p = (pointer)&rest.field_2;
          rest._M_string_length = 0;
          rest.field_2._M_local_buf[0] = '\0';
          Nibbler::getRemainder(&n,&rest);
          color_name._M_dataplus._M_p = (pointer)&color_name.field_2;
          color_name._M_string_length = 0;
          color_name.field_2._M_allocated_capacity =
               color_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          words.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          words.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          words.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          split(&words,&rest,' ');
          for (__lhs = words.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              __lhs != words.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
            if (__lhs->_M_string_length != 0) {
              bVar1 = std::operator==(__lhs,"line");
              if (!bVar1) {
                bVar1 = std::operator==(__lhs,"match");
                if (!bVar1) {
                  bVar1 = std::operator==(__lhs,"suppress");
                  if (!bVar1) {
                    bVar1 = std::operator==(__lhs,"blank");
                    if (!bVar1) {
                      if (color_name._M_string_length != 0) {
                        std::__cxx11::string::append((char *)&color_name);
                      }
                      std::__cxx11::string::append((string *)&color_name);
                      goto LAB_0010aca5;
                    }
                  }
                }
              }
              std::__cxx11::string::_M_assign((string *)psVar4);
            }
LAB_0010aca5:
          }
          Color::Color((Color *)&rest_1,&color_name);
          Color::operator=(this_00,(Color *)&rest_1);
          Color::~Color((Color *)&rest_1);
          bVar1 = std::operator==(psVar4,"match");
          if (bVar1) {
            lVar2 = std::__cxx11::string::find('\0',0x28);
            if (lVar2 == -1) {
              std::operator+(&local_68,"(",&pattern);
              std::operator+(&rest_1,&local_68,")");
              std::__cxx11::string::operator=((string *)&pattern,(string *)&rest_1);
              std::__cxx11::string::~string((string *)&rest_1);
              std::__cxx11::string::~string((string *)&local_68);
            }
          }
          RX::RX((RX *)&rest_1,&pattern,true);
          RX::operator=(&this->rx,(RX *)&rest_1);
          RX::~RX((RX *)&rest_1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&words);
          std::__cxx11::string::~string((string *)&color_name);
          psVar4 = &rest;
          goto LAB_0010aead;
        }
      }
    }
    bVar1 = Nibbler::getQuoted(&n,'\"',&pattern,false);
    if (bVar1) {
      bVar1 = Nibbler::skipWS(&n);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rest_1,"-->",(allocator<char> *)&rest);
        bVar1 = Nibbler::getLiteral(&n,&rest_1);
        std::__cxx11::string::~string((string *)&rest_1);
        if (bVar1) {
          Nibbler::skipWS(&n);
          rest_1._M_dataplus._M_p = (pointer)&rest_1.field_2;
          rest_1._M_string_length = 0;
          rest_1.field_2._M_local_buf[0] = '\0';
          Nibbler::getRemainder(&n,&rest_1);
          rest._M_dataplus._M_p = (pointer)&rest.field_2;
          rest._M_string_length = 0;
          rest.field_2._M_local_buf[0] = '\0';
          color_name._M_dataplus._M_p = (pointer)0x0;
          color_name._M_string_length = 0;
          color_name.field_2._M_allocated_capacity = 0;
          split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&color_name,&rest_1,' ');
          for (__lhs_00 = color_name._M_dataplus;
              __lhs_00._M_p != (pointer)color_name._M_string_length;
              __lhs_00._M_p = __lhs_00._M_p + 0x20) {
            if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs_00._M_p)
                ->_M_string_length != 0) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs_00._M_p,"line");
              if (!bVar1) {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs_00._M_p,"match");
                if (!bVar1) {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs_00._M_p,"suppress");
                  if (!bVar1) {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__lhs_00._M_p,"blank");
                    if (!bVar1) {
                      if (rest._M_string_length != 0) {
                        std::__cxx11::string::append((char *)&rest);
                      }
                      std::__cxx11::string::append((string *)&rest);
                      goto LAB_0010ae1d;
                    }
                  }
                }
              }
              std::__cxx11::string::_M_assign((string *)psVar4);
            }
LAB_0010ae1d:
          }
          Color::Color((Color *)&local_68,&rest);
          Color::operator=(this_00,(Color *)&local_68);
          Color::~Color((Color *)&local_68);
          std::__cxx11::string::_M_assign((string *)&this->fragment);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&color_name);
          std::__cxx11::string::~string((string *)&rest);
          psVar4 = &rest_1;
LAB_0010aead:
          std::__cxx11::string::~string((string *)psVar4);
          std::__cxx11::string::~string((string *)&pattern);
          Nibbler::~Nibbler(&n);
          return;
        }
      }
    }
  }
LAB_0010b004:
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 1;
  __cxa_throw(puVar3,&int::typeinfo,0);
}

Assistant:

Rule::Rule (const std::string& line)
{
  fragment = "";

  Nibbler n (line);
  n.skipWS ();

  std::string pattern;
  if (n.getUntilWS (section)     &&
      n.skipWS ()                &&
      n.getLiteral ("rule")      &&
      n.skipWS ())
  {
    // <section> rule /<pattern>/
    if (n.getQuoted ('/', pattern) &&
        n.skipWS ()                &&
        n.getLiteral ("-->"))
    {
      n.skipWS ();

      std::string rest;
      n.getRemainder (rest);

      std::string color_name;
      std::vector <std::string> words;
      split (words, rest, ' ');
      std::vector <std::string>::iterator i;
      for (i = words.begin (); i != words.end (); ++i)
      {
        if (i->length ())
        {
               if (*i == "line")      context = *i;
          else if (*i == "match")     context = *i;
          else if (*i == "suppress")  context = *i;
          else if (*i == "blank")     context = *i;
          else
          {
            if (color_name.length ())
              color_name += " ";

            color_name += *i;
          }
        }
      }

      color = Color (color_name);

      // Now for "match" context patterns, add an enclosing ( ... ) is not
      // already present.
      if (context == "match")
        if (pattern.find ('(') == std::string::npos)
          pattern = "(" + pattern + ")";

      rx = RX (pattern, true);
      return;
    }

    // <section> rule "<pattern>"
    else if (n.getQuoted ('"', pattern) &&
             n.skipWS ()                &&
             n.getLiteral ("-->"))
    {
      n.skipWS ();

      std::string rest;
      n.getRemainder (rest);

      std::string color_name;
      std::vector <std::string> words;
      split (words, rest, ' ');
      std::vector <std::string>::iterator i;
      for (i = words.begin (); i != words.end (); ++i)
      {
        if (i->length ())
        {
               if (*i == "line")      context = *i;
          else if (*i == "match")     context = *i;
          else if (*i == "suppress")  context = *i;
          else if (*i == "blank")     context = *i;
          // TODO Support context "datetime", "time"
          else
          {
            if (color_name.length ())
              color_name += " ";

            color_name += *i;
          }
        }
      }

      color = Color (color_name);
      fragment = pattern;
      return;
    }
  }

  // Indicates that 'line' was not a rule def, but a blank line or similar.
  throw int (1);
}